

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_clamp(ggml_context *ctx,ggml_tensor *a,float min,float max)

{
  ggml_tensor *tensor;
  ggml_tensor *in_RSI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  float params [2];
  ggml_tensor *result;
  
  tensor = ggml_view_tensor((ggml_context *)in_RSI,(ggml_tensor *)CONCAT44(in_XMM0_Da,in_XMM1_Da));
  ggml_set_op_params(tensor,(void *)CONCAT44(in_XMM1_Da,in_XMM0_Da),0x14fe07);
  tensor->op = GGML_OP_CLAMP;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_clamp(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        float                 min,
        float                 max) {
    // TODO: when implement backward, fix this:
    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    float params[] = { min, max };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_CLAMP;
    result->src[0] = a;

    return result;
}